

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O1

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::image
          (ImGuiDrawListGraphicsAdaptor *this,float x,float y,float w,float h,char *data_rgb,
          int cols,int rows)

{
  GLuint image_texture;
  float local_88;
  float local_78;
  float local_68;
  float local_58;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  
  local_88 = x;
  local_78 = y;
  local_68 = w;
  local_58 = h;
  glGenTextures(1,&image_texture);
  glBindTexture(0xde1,image_texture);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2800,0x2601);
  glTexParameteri(0xde1,0x2802,0x812f);
  glTexParameteri(0xde1,0x2803,0x812f);
  glTexImage2D(0xde1,0,0x1907,cols,rows,0,0x1907,0x1401,data_rgb);
  local_30.x = local_88;
  local_30.y = local_78;
  local_38.y = local_58 + local_78;
  local_38.x = local_68 + local_88;
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_48.x = 1.0;
  local_48.y = 1.0;
  ImDrawList::AddImage
            (this->draw_list,(ImTextureID)(ulong)image_texture,&local_30,&local_38,&local_40,
             &local_48,0xffffffff);
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::image(float x, float y, float w, float h,
                                         char* data_rgb, int cols, int rows) {
    GLuint image_texture;
    glGenTextures(1, &image_texture);
    glBindTexture(GL_TEXTURE_2D, image_texture);

    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, cols, rows, 0, GL_RGB,
                 GL_UNSIGNED_BYTE, data_rgb);
    draw_list->AddImage((void*)(intptr_t)image_texture, ImVec2(x, y),
                        ImVec2(x + w, y + h));
}